

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression * soul::ExpressionHelpers::createStruct(Expression *__return_storage_ptr__,Structure *s)

{
  soul *this;
  pointer pcVar1;
  TypeDeclarationBase *t;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this = (soul *)s->backlinkToASTObject;
  if (this != (soul *)0x0) {
    pcVar1 = (s->name)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (s->name)._M_string_length);
    makeUID_abi_cxx11_(&local_80,this,t);
    createStruct(__return_storage_ptr__,&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (this != (soul *)0x0) {
      return __return_storage_ptr__;
    }
  }
  pcVar1 = (s->name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (s->name)._M_string_length);
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  createStruct(__return_storage_ptr__,&local_40,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createStruct (Structure& s)
    {
        if (auto structDecl = reinterpret_cast<AST::StructDeclaration*> (s.backlinkToASTObject))
            return createStruct (s.getName(), makeUID (*structDecl));

        return createStruct (s.getName(), {});
    }